

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  byte *cur;
  CLzRef *pCVar2;
  UInt32 UVar3;
  UInt32 UVar4;
  byte *pbVar5;
  UInt32 *pUVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ptrdiff_t diff;
  long lVar12;
  byte *pbVar6;
  
  lenLimit = p->lenLimit;
  uVar9 = (ulong)lenLimit;
  if (uVar9 < 3) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar10 = (uint)cur[1] ^ p->crc[*cur];
  uVar11 = uVar10 & 0x3ff;
  pCVar2 = p->hash;
  CVar1 = p->pos;
  uVar8 = CVar1 - pCVar2[uVar11];
  uVar10 = (((uint)cur[2] << 8 ^ uVar10) & p->hashMask) + 0x400;
  UVar4 = pCVar2[uVar10];
  pCVar2[uVar11] = CVar1;
  pCVar2[uVar10] = CVar1;
  UVar3 = 2;
  if ((uVar8 < p->cyclicBufferSize) && (cur[-(ulong)uVar8] == *cur)) {
    pbVar5 = cur + 2;
    lVar12 = uVar9 - 2;
    do {
      pbVar6 = pbVar5;
      if (pbVar5[-(ulong)uVar8] != *pbVar5) break;
      pbVar5 = pbVar5 + 1;
      lVar12 = lVar12 + -1;
      pbVar6 = cur + uVar9;
    } while (lVar12 != 0);
    UVar3 = (int)pbVar6 - (int)cur;
    *distances = UVar3;
    distances[1] = uVar8 - 1;
    lVar12 = 2;
    if (lenLimit == UVar3) {
      SkipMatchesSpec(lenLimit,UVar4,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar4 = p->pos + 1;
      p->pos = UVar4;
      UVar3 = 2;
      goto LAB_00112fd2;
    }
  }
  else {
    lVar12 = 0;
  }
  pUVar7 = GetMatchesSpec1(lenLimit,UVar4,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                           p->cutValue,distances + lVar12,UVar3);
  UVar3 = (UInt32)((ulong)((long)pUVar7 - (long)distances) >> 2);
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar4 = p->pos + 1;
  p->pos = UVar4;
LAB_00112fd2:
  if (UVar4 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar3;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, d2, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[h2];

  curMatch = hash[kFix3HashSize + hv];
  
  hash[h2] = pos;
  hash[kFix3HashSize + hv] = pos;

  maxLen = 2;
  offset = 0;

  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    UPDATE_maxLen
    distances[0] = maxLen;
    distances[1] = d2 - 1;
    offset = 2;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  GET_MATCHES_FOOTER(offset, maxLen)
}